

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::ByteSizeLong
          (NonMaximumSuppressionLayerParams *this)

{
  bool bVar1;
  int iVar2;
  uint64 uVar3;
  size_t sVar4;
  float fVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  NonMaximumSuppressionLayerParams *this_local;
  
  sStack_18 = 0;
  fVar5 = iouthreshold(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    sStack_18 = 5;
  }
  fVar5 = scorethreshold(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    sStack_18 = sStack_18 + 5;
  }
  uVar3 = maxboxes(this);
  if (uVar3 != 0) {
    uVar3 = maxboxes(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar3);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  bVar1 = perclasssuppression(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t NonMaximumSuppressionLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NonMaximumSuppressionLayerParams)
  size_t total_size = 0;

  // float iouThreshold = 1;
  if (this->iouthreshold() != 0) {
    total_size += 1 + 4;
  }

  // float scoreThreshold = 2;
  if (this->scorethreshold() != 0) {
    total_size += 1 + 4;
  }

  // uint64 maxBoxes = 3;
  if (this->maxboxes() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->maxboxes());
  }

  // bool perClassSuppression = 4;
  if (this->perclasssuppression() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}